

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PianoWidget.cpp
# Opt level: O2

void __thiscall PianoWidget::paintEvent(PianoWidget *this,QPaintEvent *event)

{
  long lVar1;
  byte bVar2;
  Pixmaps PVar3;
  undefined1 *puVar4;
  int iVar5;
  int iVar6;
  QPainter painter;
  QRect local_48;
  undefined4 local_30;
  undefined8 local_2c;
  undefined2 local_24;
  
  bVar2 = 0;
  iVar6 = 0;
  iVar5 = 0;
  if (this->mIsKeyDown == true) {
    iVar5 = (this->mNote / 0xc) * 0x54;
    lVar1 = (long)(this->mNote % 0xc);
    bVar2 = PianoWidgetTU::KEY_INFO[lVar1 * 8];
    iVar6 = *(int *)(PianoWidgetTU::KEY_INFO + lVar1 * 8 + 4);
  }
  puVar4 = &this->field_0x10;
  QPainter::QPainter(&painter,(QPaintDevice *)puVar4);
  getPixmap((PianoWidget *)&local_48,(Pixmaps)puVar4);
  PVar3 = PixWhiteKeyDown;
  QPainter::drawPixmap(&painter,0,0,(QPixmap *)&local_48);
  QPixmap::~QPixmap((QPixmap *)&local_48);
  if (((~this->mIsKeyDown | bVar2) & 1) == 0) {
    getPixmap((PianoWidget *)&local_48,PVar3);
    PVar3 = iVar5 + iVar6;
    QPainter::drawPixmap(&painter,PVar3,0,(QPixmap *)&local_48);
    QPixmap::~QPixmap((QPixmap *)&local_48);
  }
  getPixmap((PianoWidget *)&local_48,PVar3);
  PVar3 = PixWhiteKeyDown;
  QPainter::drawPixmap(&painter,0,0,(QPixmap *)&local_48);
  QPixmap::~QPixmap((QPixmap *)&local_48);
  if ((bVar2 & this->mIsKeyDown) == 1) {
    getPixmap((PianoWidget *)&local_48,PVar3);
    QPainter::drawPixmap(&painter,iVar5 + iVar6,0,(QPixmap *)&local_48);
    QPixmap::~QPixmap((QPixmap *)&local_48);
  }
  if ((*(byte *)(*(long *)&this->field_0x20 + 8) & 1) != 0) {
    QPainter::setCompositionMode((CompositionMode)&painter);
    local_48 = QWidget::rect(&this->super_QWidget);
    local_30 = 1;
    local_2c = 0x808080808080ffff;
    local_24 = 0;
    QPainter::fillRect((QRect *)&painter,(QColor *)&local_48);
  }
  QPainter::~QPainter(&painter);
  return;
}

Assistant:

void PianoWidget::paintEvent(QPaintEvent *event) {
    (void)event;

    int octaveOffset = 0;
    TU::KeyPaintInfo keyInfo{ false, 0 };

    if (mIsKeyDown) {
        octaveOffset = mNote / 12;
        int keyInOctave = mNote % 12;
        octaveOffset *= TU::N_WHITEKEYS * TU::WKEY_WIDTH;

        keyInfo = TU::KEY_INFO[keyInOctave];
    }

    QPainter painter(this);
    painter.drawPixmap(0, 0, getPixmap(PixWhiteKeys));
    
    if (mIsKeyDown && !keyInfo.isBlack) {
        painter.drawPixmap(octaveOffset + keyInfo.xoffset, 0, getPixmap(PixWhiteKeyDown));
    }

    painter.drawPixmap(0, 0, getPixmap(PixBlackKeys));

    if (mIsKeyDown && keyInfo.isBlack) {
        painter.drawPixmap(octaveOffset + keyInfo.xoffset, 0, getPixmap(PixBlackKeyDown));
    }

    if (!isEnabled()) {
        painter.setCompositionMode(QPainter::CompositionMode_Plus);
        painter.fillRect(rect(), QColor(128, 128, 128));
    }

}